

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_>_> *fadexpr)

{
  double __x;
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  Fad<double> *pFVar5;
  uint uVar6;
  double *pdVar7;
  FadExpr<FadFuncAtan<Fad<double>_>_> *pFVar8;
  ulong uVar9;
  double dVar10;
  value_type vVar11;
  double dVar12;
  
  pFVar8 = (fadexpr->fadexpr_).left_;
  uVar6 = (pFVar8->fadexpr_).expr_.dx_.num_elts;
  uVar3 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 < (int)uVar6) {
    uVar3 = uVar6;
  }
  uVar4 = (this->dx_).num_elts;
  if (uVar3 == uVar4) {
    if (uVar3 == 0) goto LAB_01413356;
    pdVar7 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar3 == 0) {
      if (uVar4 != 0) {
        pdVar7 = (this->dx_).ptr_to_data;
        if (pdVar7 != (double *)0x0) {
          operator_delete__(pdVar7);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_01413356;
    }
    if (uVar4 != 0) {
      pdVar7 = (this->dx_).ptr_to_data;
      if (pdVar7 != (double *)0x0) {
        operator_delete__(pdVar7);
        pFVar8 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar3;
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar3) {
      uVar9 = (ulong)uVar3 << 3;
    }
    pdVar7 = (double *)operator_new__(uVar9);
    (this->dx_).ptr_to_data = pdVar7;
    uVar6 = (pFVar8->fadexpr_).expr_.dx_.num_elts;
  }
  if ((uVar6 == 0) || ((((fadexpr->fadexpr_).right_)->dx_).num_elts == 0)) {
    if (0 < (int)uVar3) {
      uVar9 = 0;
      do {
        vVar11 = FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_>::dx
                           (&fadexpr->fadexpr_,(int)uVar9);
        pdVar7[uVar9] = vVar11;
        uVar9 = uVar9 + 1;
      } while (uVar3 != uVar9);
    }
  }
  else if (0 < (int)uVar3) {
    uVar9 = 0;
    do {
      pFVar8 = (fadexpr->fadexpr_).left_;
      pFVar5 = (fadexpr->fadexpr_).right_;
      dVar12 = (pFVar8->fadexpr_).expr_.dx_.ptr_to_data[uVar9];
      __x = (pFVar8->fadexpr_).expr_.val_;
      dVar1 = (pFVar5->dx_).ptr_to_data[uVar9];
      dVar2 = pFVar5->val_;
      dVar10 = atan(__x);
      pdVar7[uVar9] = dVar10 * dVar1 + (dVar12 / (__x * __x + 1.0)) * dVar2;
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
  }
LAB_01413356:
  dVar12 = atan((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.val_);
  this->val_ = dVar12 * ((fadexpr->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}